

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::_makenone(TranslateToFuzzReader *this)

{
  WeightedOption weightedOption;
  WeightedOption rest;
  WeightedOption rest_1;
  WeightedOption rest_2;
  WeightedOption rest_3;
  WeightedOption rest_4;
  Index IVar1;
  FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *pFVar2;
  long *plVar3;
  long extraout_RDX;
  code *local_1e8;
  Type local_1a0;
  code *local_198;
  undefined8 local_190;
  FeatureSet local_184;
  code *local_180;
  undefined8 local_178;
  FeatureSet local_16c;
  code *local_168;
  undefined8 local_160;
  FeatureSet local_154;
  code *local_150;
  undefined8 uStack_148;
  code *local_140;
  undefined8 uStack_138;
  code *local_130;
  undefined8 uStack_128;
  code *local_120;
  undefined8 local_118;
  code *local_110;
  undefined8 local_108;
  code *local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  code *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  code *local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  code *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  code *local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  code *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  FeatureSet local_5c;
  undefined1 auStack_58 [8];
  FeatureOptions<Expression_*(Self::*)(Type)> options;
  Index choice;
  TranslateToFuzzReader *this_local;
  
  IVar1 = upTo(this,100);
  if (IVar1 < this->LOGGING_PERCENT) {
    if (IVar1 < this->LOGGING_PERCENT >> 1) {
      this_local = (TranslateToFuzzReader *)makeLogging(this);
    }
    else {
      this_local = (TranslateToFuzzReader *)makeMemoryHashLogging(this);
    }
  }
  else {
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    auStack_58 = (undefined1  [8])0x0;
    options.options._M_t._M_impl._0_8_ = 0;
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
    FeatureOptions((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *
                   )auStack_58);
    FeatureSet::FeatureSet(&local_5c,0);
    local_88 = makeLocalSet;
    uStack_80 = 0;
    local_78 = 4;
    local_a0 = makeBlock;
    uStack_98 = 0;
    local_90 = 2;
    local_b8 = makeIf;
    uStack_b0 = 0;
    local_a8 = 2;
    local_d0 = makeLoop;
    uStack_c8 = 0;
    local_c0 = 2;
    local_e8 = makeBreak;
    uStack_e0 = 0;
    local_d8 = 2;
    local_100 = makeStore;
    uStack_f8 = 0;
    local_f0 = 2;
    local_110 = makeCall;
    local_108 = 0;
    local_120 = makeCallIndirect;
    local_118 = 0;
    local_130 = makeDrop;
    uStack_128 = 0;
    local_140 = makeNop;
    uStack_138 = 0;
    local_150 = makeGlobalSet;
    uStack_148 = 0;
    weightedOption.weight = 4;
    weightedOption._0_16_ = ZEXT816(0x1e9cb0);
    rest.weight = 2;
    rest._0_16_ = ZEXT816(0x1e8660);
    rest_1.weight = 2;
    rest_1._0_16_ = ZEXT816(0x1eb370);
    rest_2.weight = 2;
    rest_2._0_16_ = ZEXT816(0x1eb430);
    rest_3.weight = 2;
    rest_3._0_16_ = ZEXT816(0x1eb6e0);
    rest_4.weight = 2;
    rest_4._0_16_ = ZEXT816(0x1f0e40);
    pFVar2 = Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
             add<wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                       ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                         *)auStack_58,local_5c,weightedOption,rest,rest_1,rest_2,rest_3,rest_4,
                        0x1ebbb0,0,0x1ebf30,0,0x1f0fb0);
    FeatureSet::FeatureSet(&local_154,0x10);
    local_168 = makeBulkMemory;
    local_160 = 0;
    pFVar2 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar2,local_154,0x1f1200);
    FeatureSet::FeatureSet(&local_16c,1);
    local_180 = makeAtomic;
    local_178 = 0;
    pFVar2 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar2,local_16c,0x1eeec0);
    FeatureSet::FeatureSet(&local_184,0x500);
    local_198 = makeCallRef;
    local_190 = 0;
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
              (pFVar2,local_184,0x1ec400);
    local_1e8 = (code *)_wasm__TranslateToFuzzReader___constwasm__TranslateToFuzzReader__pick<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_wasm__Random__FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>___
                                  (this,(FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                                         *)auStack_58);
    plVar3 = (long *)((long)&this->wasm + extraout_RDX);
    if (((ulong)local_1e8 & 1) != 0) {
      local_1e8 = *(code **)(local_1e8 + *plVar3 + -1);
    }
    Type::Type(&local_1a0,none);
    this_local = (TranslateToFuzzReader *)(*local_1e8)(plVar3,local_1a0.id);
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
    ~FeatureOptions((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                     *)auStack_58);
  }
  return (Expression *)this_local;
}

Assistant:

Expression* TranslateToFuzzReader::_makenone() {
  auto choice = upTo(100);
  if (choice < LOGGING_PERCENT) {
    if (choice < LOGGING_PERCENT / 2) {
      return makeLogging();
    } else {
      return makeMemoryHashLogging();
    }
  }
  using Self = TranslateToFuzzReader;
  auto options = FeatureOptions<Expression* (Self::*)(Type)>();
  using WeightedOption = decltype(options)::WeightedOption;
  options
    .add(FeatureSet::MVP,
         WeightedOption{&Self::makeLocalSet, VeryImportant},
         WeightedOption{&Self::makeBlock, Important},
         WeightedOption{&Self::makeIf, Important},
         WeightedOption{&Self::makeLoop, Important},
         WeightedOption{&Self::makeBreak, Important},
         WeightedOption{&Self::makeStore, Important},
         &Self::makeCall,
         &Self::makeCallIndirect,
         &Self::makeDrop,
         &Self::makeNop,
         &Self::makeGlobalSet)
    .add(FeatureSet::BulkMemory, &Self::makeBulkMemory)
    .add(FeatureSet::Atomics, &Self::makeAtomic)
    .add(FeatureSet::GC | FeatureSet::ReferenceTypes, &Self::makeCallRef);
  return (this->*pick(options))(Type::none);
}